

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

String * __thiscall
LiteScript::Character::operator*(String *__return_storage_ptr__,Character *this,uint nb)

{
  bool bVar1;
  String cpy;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> bStack_38;
  
  (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2;
  (__return_storage_ptr__->str)._M_string_length = 0;
  (__return_storage_ptr__->str).field_2._M_local_buf[0] = L'\0';
  String::String((String *)&bStack_38,(this->str->str)._M_dataplus._M_p[this->i]);
  while (bVar1 = nb != 0, nb = nb - 1, bVar1) {
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    append(&__return_storage_ptr__->str,&bStack_38);
  }
  std::__cxx11::u32string::~u32string((u32string *)&bStack_38);
  return __return_storage_ptr__;
}

Assistant:

LiteScript::String LiteScript::Character::operator*(unsigned int nb) const {
    String res, cpy(this->str[this->i]);
    for (unsigned int j = 0; j < nb; j++)
        res += cpy;
    return res;
}